

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O0

void WebRtc_rdft(size_t n,int isgn,float *a,size_t *ip,float *w)

{
  float fVar1;
  size_t sStack_40;
  float xi;
  size_t nc;
  size_t nw;
  float *w_local;
  size_t *ip_local;
  float *a_local;
  int isgn_local;
  size_t n_local;
  
  nc = *ip;
  if (nc << 2 < n) {
    nc = n >> 2;
    makewt(nc,ip,w);
  }
  sStack_40 = ip[1];
  if (sStack_40 << 2 < n) {
    sStack_40 = n >> 2;
    makect(sStack_40,ip,w + nc);
  }
  if (isgn < 0) {
    a[1] = (*a - a[1]) * 0.5;
    *a = *a - a[1];
    if (n < 5) {
      if (n == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      rftbsub(n,a,sStack_40,w + nc);
      bitrv2(n,ip + 2,a);
      cftbsub(n,a,w);
    }
  }
  else {
    if (n < 5) {
      if (n == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      bitrv2(n,ip + 2,a);
      cftfsub(n,a,w);
      rftfsub(n,a,sStack_40,w + nc);
    }
    fVar1 = *a;
    *a = a[1] + *a;
    a[1] = fVar1 - a[1];
  }
  return;
}

Assistant:

void WebRtc_rdft(size_t n, int isgn, float *a, size_t *ip, float *w)
{
    size_t nw, nc;
    float xi;

    nw = ip[0];
    if (n > (nw << 2)) {
        nw = n >> 2;
        makewt(nw, ip, w);
    }
    nc = ip[1];
    if (n > (nc << 2)) {
        nc = n >> 2;
        makect(nc, ip, w + nw);
    }
    if (isgn >= 0) {
        if (n > 4) {
            bitrv2(n, ip + 2, a);
            cftfsub(n, a, w);
            rftfsub(n, a, nc, w + nw);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
        xi = a[0] - a[1];
        a[0] += a[1];
        a[1] = xi;
    } else {
        a[1] = 0.5f * (a[0] - a[1]);
        a[0] -= a[1];
        if (n > 4) {
            rftbsub(n, a, nc, w + nw);
            bitrv2(n, ip + 2, a);
            cftbsub(n, a, w);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
    }
}